

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O0

void __thiscall ON_HermiteSurface::Destroy(ON_HermiteSurface *this)

{
  int iVar1;
  ON_SimpleArray<ON_3dPoint> *this_00;
  ON_SimpleArray<ON_3dVector> *pOVar2;
  int local_20;
  int local_1c;
  int i_3;
  int i_2;
  int i_1;
  int i;
  ON_HermiteSurface *this_local;
  
  ON_SimpleArray<double>::Destroy(&this->m_u_parameters);
  ON_SimpleArray<double>::Destroy(&this->m_v_parameters);
  i_2 = 0;
  while( true ) {
    iVar1 = ON_ClassArray<ON_SimpleArray<ON_3dPoint>_>::Count(&this->m_grid_points);
    if (iVar1 <= i_2) break;
    this_00 = ON_ClassArray<ON_SimpleArray<ON_3dPoint>_>::operator[](&this->m_grid_points,i_2);
    ON_SimpleArray<ON_3dPoint>::Destroy(this_00);
    i_2 = i_2 + 1;
  }
  ON_ClassArray<ON_SimpleArray<ON_3dPoint>_>::Destroy(&this->m_grid_points);
  i_3 = 0;
  while( true ) {
    iVar1 = ON_ClassArray<ON_SimpleArray<ON_3dVector>_>::Count(&this->m_u_tangents);
    if (iVar1 <= i_3) break;
    pOVar2 = ON_ClassArray<ON_SimpleArray<ON_3dVector>_>::operator[](&this->m_u_tangents,i_3);
    ON_SimpleArray<ON_3dVector>::Destroy(pOVar2);
    i_3 = i_3 + 1;
  }
  ON_ClassArray<ON_SimpleArray<ON_3dVector>_>::Destroy(&this->m_u_tangents);
  local_1c = 0;
  while( true ) {
    iVar1 = ON_ClassArray<ON_SimpleArray<ON_3dVector>_>::Count(&this->m_v_tangents);
    if (iVar1 <= local_1c) break;
    pOVar2 = ON_ClassArray<ON_SimpleArray<ON_3dVector>_>::operator[](&this->m_v_tangents,local_1c);
    ON_SimpleArray<ON_3dVector>::Destroy(pOVar2);
    local_1c = local_1c + 1;
  }
  ON_ClassArray<ON_SimpleArray<ON_3dVector>_>::Destroy(&this->m_v_tangents);
  local_20 = 0;
  while( true ) {
    iVar1 = ON_ClassArray<ON_SimpleArray<ON_3dVector>_>::Count(&this->m_twists);
    if (iVar1 <= local_20) break;
    pOVar2 = ON_ClassArray<ON_SimpleArray<ON_3dVector>_>::operator[](&this->m_twists,local_20);
    ON_SimpleArray<ON_3dVector>::Destroy(pOVar2);
    local_20 = local_20 + 1;
  }
  ON_ClassArray<ON_SimpleArray<ON_3dVector>_>::Destroy(&this->m_twists);
  return;
}

Assistant:

void ON_HermiteSurface::Destroy()
{
  m_u_parameters.Destroy();
  m_v_parameters.Destroy();

  for (int i = 0; i < m_grid_points.Count(); i++)
    m_grid_points[i].Destroy();
  m_grid_points.Destroy();

  for (int i = 0; i < m_u_tangents.Count(); i++)
    m_u_tangents[i].Destroy();
  m_u_tangents.Destroy();

  for (int i = 0; i < m_v_tangents.Count(); i++)
    m_v_tangents[i].Destroy();
  m_v_tangents.Destroy();

  for (int i = 0; i < m_twists.Count(); i++)
    m_twists[i].Destroy();
  m_twists.Destroy();
}